

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_convolve_2d_avx2.c
# Opt level: O2

void av1_highbd_convolve_2d_sr_avx2
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               InterpFilterParams *filter_params_x,InterpFilterParams *filter_params_y,
               int subpel_x_qn,int subpel_y_qn,ConvolveParams *conv_params,int bd)

{
  uint uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  ushort uVar4;
  ushort uVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  long lVar20;
  byte bVar21;
  undefined2 uVar22;
  uint uVar23;
  undefined2 uVar24;
  long lVar25;
  int iVar26;
  undefined1 (*pauVar27) [32];
  int iVar28;
  int iVar29;
  undefined1 (*pauVar30) [32];
  long lVar31;
  long lVar32;
  undefined1 (*pauVar33) [16];
  undefined1 (*pauVar34) [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  __m256i coeffs_x [4];
  __m256i coeffs_y [4];
  int16_t im_block [1120];
  __m256i local_a20;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  longlong local_9a0;
  longlong lStack_998;
  longlong lStack_990;
  longlong lStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined1 local_920 [16];
  undefined1 auStack_910 [16];
  undefined1 local_900 [16];
  undefined1 auStack_8f0 [16];
  undefined1 local_8e0 [16];
  undefined1 auStack_8d0 [16];
  undefined1 local_8c0 [16];
  undefined1 auStack_8b0 [2176];
  
  uVar4 = filter_params_x->taps;
  if (uVar4 == 0xc) {
    av1_highbd_convolve_2d_sr_ssse3
              (src,src_stride,dst,dst_stride,w,h,filter_params_x,filter_params_y,subpel_x_qn,
               subpel_y_qn,conv_params,bd);
  }
  else {
    uVar5 = filter_params_y->taps;
    bVar21 = (byte)conv_params->round_0;
    iVar28 = (1 << ((char)bd + 6U & 0x1f)) + ((1 << (bVar21 & 0x1f)) >> 1);
    uVar1 = conv_params->round_0;
    iVar29 = (-1 << (~bVar21 + (char)bd + 0xe & 0x1f)) +
             ((1 << ((byte)conv_params->round_1 & 0x1f)) >> 1);
    uVar23 = 0xe - (conv_params->round_0 + conv_params->round_1);
    uVar2 = conv_params->round_1;
    iVar26 = (1 << ((byte)uVar23 & 0x1f)) >> 1;
    uVar24 = 0xff;
    if (bd == 0xc) {
      uVar24 = 0xfff;
    }
    uVar22 = 0x3ff;
    if (bd != 10) {
      uVar22 = uVar24;
    }
    prepare_coeffs(filter_params_x,subpel_x_qn,&local_a20);
    prepare_coeffs(filter_params_y,subpel_y_qn,(__m256i *)&local_9a0);
    auVar14._4_4_ = iVar26;
    auVar14._0_4_ = iVar26;
    auVar14._8_4_ = iVar26;
    auVar14._12_4_ = iVar26;
    auVar14._16_4_ = iVar26;
    auVar14._20_4_ = iVar26;
    auVar14._24_4_ = iVar26;
    auVar14._28_4_ = iVar26;
    lVar20 = (long)(int)(h + (uint)uVar5 + -1);
    lVar25 = (long)dst_stride;
    pauVar34 = (undefined1 (*) [32])
               ((long)src +
               (2 - ((ulong)(uVar4 & 0xfffffffe) + (long)(int)(((uVar5 >> 1) - 1) * src_stride) * 2)
               ));
    for (lVar31 = 0; lVar31 < w; lVar31 = lVar31 + 8) {
      pauVar30 = (undefined1 (*) [32])local_920;
      auVar11._4_4_ = iVar28;
      auVar11._0_4_ = iVar28;
      auVar11._8_4_ = iVar28;
      auVar11._12_4_ = iVar28;
      auVar11._16_4_ = iVar28;
      auVar11._20_4_ = iVar28;
      auVar11._24_4_ = iVar28;
      auVar11._28_4_ = iVar28;
      pauVar27 = pauVar34;
      for (lVar32 = 0; lVar32 < lVar20; lVar32 = lVar32 + 2) {
        auVar36 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        if (lVar32 + 1 < lVar20) {
          auVar36 = *(undefined1 (*) [32])(*pauVar27 + (long)src_stride * 2);
        }
        auVar3 = *pauVar27;
        auVar37._0_16_ = ZEXT116(0) * auVar36._0_16_ + ZEXT116(1) * auVar3._0_16_;
        auVar37._16_16_ = ZEXT116(0) * auVar3._16_16_ + ZEXT116(1) * auVar36._0_16_;
        auVar35 = vperm2i128_avx2(auVar3,auVar36,0x31);
        auVar36 = vpalignr_avx2(auVar35,auVar37,4);
        auVar3 = vpalignr_avx2(auVar35,auVar37,8);
        auVar6 = vpalignr_avx2(auVar35,auVar37,0xc);
        auVar7 = vpmaddwd_avx2(auVar37,(undefined1  [32])local_a20);
        auVar8 = vpmaddwd_avx2(auVar36,local_a00);
        auVar36 = vpmaddwd_avx2(auVar3,local_9e0);
        auVar3 = vpmaddwd_avx2(auVar6,local_9c0);
        auVar36 = vpaddd_avx2(auVar36,auVar3);
        auVar3 = vpaddd_avx2(auVar7,auVar11);
        auVar3 = vpaddd_avx2(auVar3,auVar8);
        auVar36 = vpaddd_avx2(auVar3,auVar36);
        auVar36 = vpsrad_avx2(auVar36,ZEXT416(uVar1));
        auVar36 = vpackssdw_avx2(auVar36,(undefined1  [32])local_a20);
        auVar3 = vpalignr_avx2(auVar35,auVar37,2);
        auVar6 = vpalignr_avx2(auVar35,auVar37,6);
        auVar7 = vpalignr_avx2(auVar35,auVar37,10);
        auVar8 = vpalignr_avx2(auVar35,auVar37,0xe);
        auVar35 = vpmaddwd_avx2(auVar3,(undefined1  [32])local_a20);
        auVar3 = vpmaddwd_avx2(auVar6,local_a00);
        auVar6 = vpmaddwd_avx2(auVar7,local_9e0);
        auVar3 = vpaddd_avx2(auVar3,auVar6);
        auVar7 = vpmaddwd_avx2(auVar8,local_9c0);
        auVar6 = vpaddd_avx2(auVar35,auVar11);
        auVar3 = vpaddd_avx2(auVar6,auVar3);
        auVar3 = vpaddd_avx2(auVar3,auVar7);
        auVar3 = vpsrad_avx2(auVar3,ZEXT416(uVar1));
        auVar3 = vpackssdw_avx2(auVar3,(undefined1  [32])local_a20);
        auVar36 = vpunpcklwd_avx2(auVar36,auVar3);
        *pauVar30 = auVar36;
        pauVar30 = pauVar30 + 1;
        pauVar27 = (undefined1 (*) [32])(*pauVar27 + (long)src_stride * 4);
      }
      auVar36._16_16_ = auStack_910;
      auVar36._0_16_ = local_920;
      auVar3._16_16_ = local_900;
      auVar3._0_16_ = auStack_910;
      auVar9._16_16_ = auStack_8f0;
      auVar9._0_16_ = local_900;
      auVar10._16_16_ = local_8e0;
      auVar10._0_16_ = auStack_8f0;
      auVar12._16_16_ = auStack_8d0;
      auVar12._0_16_ = local_8e0;
      auVar19._16_16_ = local_8c0;
      auVar19._0_16_ = auStack_8d0;
      auVar6 = vpunpcklwd_avx2(auVar36,auVar3);
      auVar7 = vpunpcklwd_avx2(auVar9,auVar10);
      auVar8 = vpunpcklwd_avx2(auVar12,auVar19);
      auVar11 = vpunpckhwd_avx2(auVar36,auVar3);
      auVar36 = vpunpckhwd_avx2(auVar9,auVar10);
      auVar3 = vpunpckhwd_avx2(auVar12,auVar19);
      pauVar30 = (undefined1 (*) [32])auStack_8b0;
      auVar35._8_8_ = uStack_938;
      auVar35._0_8_ = local_940;
      auVar35._16_8_ = uStack_930;
      auVar35._24_8_ = uStack_928;
      pauVar33 = (undefined1 (*) [16])dst;
      for (lVar32 = 0; auVar37 = auVar8, lVar32 < h; lVar32 = lVar32 + 2) {
        auVar8 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar30[-1] + 0x10),*pauVar30);
        auVar12 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar30[-1] + 0x10),*pauVar30);
        auVar17._8_8_ = lStack_998;
        auVar17._0_8_ = local_9a0;
        auVar17._16_8_ = lStack_990;
        auVar17._24_8_ = lStack_988;
        auVar9 = vpmaddwd_avx2(auVar6,auVar17);
        auVar16._8_8_ = uStack_978;
        auVar16._0_8_ = local_980;
        auVar16._16_8_ = uStack_970;
        auVar16._24_8_ = uStack_968;
        auVar6 = vpmaddwd_avx2(auVar7,auVar16);
        auVar15._8_8_ = uStack_958;
        auVar15._0_8_ = local_960;
        auVar15._16_8_ = uStack_950;
        auVar15._24_8_ = uStack_948;
        auVar10 = vpmaddwd_avx2(auVar37,auVar15);
        auVar6 = vpaddd_avx2(auVar6,auVar10);
        auVar10 = vpmaddwd_avx2(auVar8,auVar35);
        auVar18._4_4_ = iVar29;
        auVar18._0_4_ = iVar29;
        auVar18._8_4_ = iVar29;
        auVar18._12_4_ = iVar29;
        auVar18._16_4_ = iVar29;
        auVar18._20_4_ = iVar29;
        auVar18._24_4_ = iVar29;
        auVar18._28_4_ = iVar29;
        auVar9 = vpaddd_avx2(auVar9,auVar18);
        auVar6 = vpaddd_avx2(auVar9,auVar6);
        auVar6 = vpaddd_avx2(auVar10,auVar6);
        auVar6 = vpsrad_avx2(auVar6,ZEXT416(uVar2));
        auVar6 = vpaddd_avx2(auVar6,auVar14);
        auVar6 = vpsrad_avx2(auVar6,ZEXT416(uVar23));
        if (lVar31 < (long)w + -4) {
          auVar9 = vpmaddwd_avx2(auVar36,auVar16);
          auVar10 = vpmaddwd_avx2(auVar3,auVar15);
          auVar9 = vpaddd_avx2(auVar9,auVar10);
          auVar11 = vpmaddwd_avx2(auVar11,auVar17);
          auVar11 = vpaddd_avx2(auVar11,auVar18);
          auVar11 = vpaddd_avx2(auVar11,auVar9);
          auVar9 = vpmaddwd_avx2(auVar12,auVar35);
          auVar11 = vpaddd_avx2(auVar11,auVar9);
          auVar11 = vpsrad_avx2(auVar11,ZEXT416(uVar2));
          auVar11 = vpaddd_avx2(auVar11,auVar14);
          auVar11 = vpsrad_avx2(auVar11,ZEXT416(uVar23));
          auVar11 = vpackssdw_avx2(auVar6,auVar11);
          auVar13._2_2_ = uVar22;
          auVar13._0_2_ = uVar22;
          auVar13._4_2_ = uVar22;
          auVar13._6_2_ = uVar22;
          auVar13._8_2_ = uVar22;
          auVar13._10_2_ = uVar22;
          auVar13._12_2_ = uVar22;
          auVar13._14_2_ = uVar22;
          auVar13._16_2_ = uVar22;
          auVar13._18_2_ = uVar22;
          auVar13._20_2_ = uVar22;
          auVar13._22_2_ = uVar22;
          auVar13._24_2_ = uVar22;
          auVar13._26_2_ = uVar22;
          auVar13._28_2_ = uVar22;
          auVar13._30_2_ = uVar22;
          auVar11 = vpminsw_avx2(auVar11,auVar13);
          auVar11 = vpmaxsw_avx2(auVar11,_DAT_00470720);
          *pauVar33 = auVar11._0_16_;
          *(undefined1 (*) [16])((long)*pauVar33 + lVar25 * 2) = auVar11._16_16_;
        }
        else {
          auVar11 = vpackssdw_avx2(auVar6,auVar6);
          auVar6._2_2_ = uVar22;
          auVar6._0_2_ = uVar22;
          auVar6._4_2_ = uVar22;
          auVar6._6_2_ = uVar22;
          auVar6._8_2_ = uVar22;
          auVar6._10_2_ = uVar22;
          auVar6._12_2_ = uVar22;
          auVar6._14_2_ = uVar22;
          auVar6._16_2_ = uVar22;
          auVar6._18_2_ = uVar22;
          auVar6._20_2_ = uVar22;
          auVar6._22_2_ = uVar22;
          auVar6._24_2_ = uVar22;
          auVar6._26_2_ = uVar22;
          auVar6._28_2_ = uVar22;
          auVar6._30_2_ = uVar22;
          auVar11 = vpminsw_avx2(auVar11,auVar6);
          auVar11 = vpmaxsw_avx2(auVar11,_DAT_00470720);
          if (w == 4) {
            *(long *)*pauVar33 = auVar11._0_8_;
            *(long *)((long)*pauVar33 + lVar25 * 2) = auVar11._16_8_;
          }
          else {
            *(int *)*pauVar33 = auVar11._0_4_;
            *(int *)((long)*pauVar33 + lVar25 * 2) = auVar11._16_4_;
          }
        }
        pauVar30 = pauVar30 + 1;
        pauVar33 = (undefined1 (*) [16])((long)*pauVar33 + lVar25 * 2 * 2);
        auVar6 = auVar7;
        auVar11 = auVar36;
        auVar7 = auVar37;
        auVar36 = auVar3;
        auVar3 = auVar12;
      }
      pauVar34 = (undefined1 (*) [32])(*pauVar34 + 0x10);
      dst = (uint16_t *)((long)dst + 0x10);
    }
  }
  return;
}

Assistant:

void av1_highbd_convolve_2d_sr_avx2(const uint16_t *src, int src_stride,
                                    uint16_t *dst, int dst_stride, int w, int h,
                                    const InterpFilterParams *filter_params_x,
                                    const InterpFilterParams *filter_params_y,
                                    const int subpel_x_qn,
                                    const int subpel_y_qn,
                                    ConvolveParams *conv_params, int bd) {
  if (filter_params_x->taps == 12) {
    av1_highbd_convolve_2d_sr_ssse3(src, src_stride, dst, dst_stride, w, h,
                                    filter_params_x, filter_params_y,
                                    subpel_x_qn, subpel_y_qn, conv_params, bd);
    return;
  }

  DECLARE_ALIGNED(32, int16_t, im_block[(MAX_SB_SIZE + MAX_FILTER_TAP) * 8]);
  int im_h = h + filter_params_y->taps - 1;
  int im_stride = 8;
  int i, j;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride - fo_horiz;

  // Check that, even with 12-bit input, the intermediate values will fit
  // into an unsigned 16-bit intermediate array.
  assert(bd + FILTER_BITS + 2 - conv_params->round_0 <= 16);

  __m256i s[8], coeffs_y[4], coeffs_x[4];

  const __m256i round_const_x = _mm256_set1_epi32(
      ((1 << conv_params->round_0) >> 1) + (1 << (bd + FILTER_BITS - 1)));
  const __m128i round_shift_x = _mm_cvtsi32_si128(conv_params->round_0);

  const __m256i round_const_y = _mm256_set1_epi32(
      ((1 << conv_params->round_1) >> 1) -
      (1 << (bd + 2 * FILTER_BITS - conv_params->round_0 - 1)));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);

  const int bits =
      FILTER_BITS * 2 - conv_params->round_0 - conv_params->round_1;
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);
  const __m256i round_const_bits = _mm256_set1_epi32((1 << bits) >> 1);
  const __m256i clip_pixel =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_x, subpel_x_qn, coeffs_x);
  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    /* Horizontal filter */
    {
      for (i = 0; i < im_h; i += 2) {
        const __m256i row0 =
            _mm256_loadu_si256((__m256i *)&src_ptr[i * src_stride + j]);
        __m256i row1 = _mm256_setzero_si256();
        if (i + 1 < im_h)
          row1 =
              _mm256_loadu_si256((__m256i *)&src_ptr[(i + 1) * src_stride + j]);

        const __m256i r0 = _mm256_permute2x128_si256(row0, row1, 0x20);
        const __m256i r1 = _mm256_permute2x128_si256(row0, row1, 0x31);

        // even pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 0);
        s[1] = _mm256_alignr_epi8(r1, r0, 4);
        s[2] = _mm256_alignr_epi8(r1, r0, 8);
        s[3] = _mm256_alignr_epi8(r1, r0, 12);

        __m256i res_even = convolve(s, coeffs_x);
        res_even = _mm256_sra_epi32(_mm256_add_epi32(res_even, round_const_x),
                                    round_shift_x);

        // odd pixels
        s[0] = _mm256_alignr_epi8(r1, r0, 2);
        s[1] = _mm256_alignr_epi8(r1, r0, 6);
        s[2] = _mm256_alignr_epi8(r1, r0, 10);
        s[3] = _mm256_alignr_epi8(r1, r0, 14);

        __m256i res_odd = convolve(s, coeffs_x);
        res_odd = _mm256_sra_epi32(_mm256_add_epi32(res_odd, round_const_x),
                                   round_shift_x);

        __m256i res_even1 = _mm256_packs_epi32(res_even, res_even);
        __m256i res_odd1 = _mm256_packs_epi32(res_odd, res_odd);
        __m256i res = _mm256_unpacklo_epi16(res_even1, res_odd1);

        _mm256_store_si256((__m256i *)&im_block[i * im_stride], res);
      }
    }

    /* Vertical filter */
    {
      __m256i s0 = _mm256_loadu_si256((__m256i *)(im_block + 0 * im_stride));
      __m256i s1 = _mm256_loadu_si256((__m256i *)(im_block + 1 * im_stride));
      __m256i s2 = _mm256_loadu_si256((__m256i *)(im_block + 2 * im_stride));
      __m256i s3 = _mm256_loadu_si256((__m256i *)(im_block + 3 * im_stride));
      __m256i s4 = _mm256_loadu_si256((__m256i *)(im_block + 4 * im_stride));
      __m256i s5 = _mm256_loadu_si256((__m256i *)(im_block + 5 * im_stride));

      s[0] = _mm256_unpacklo_epi16(s0, s1);
      s[1] = _mm256_unpacklo_epi16(s2, s3);
      s[2] = _mm256_unpacklo_epi16(s4, s5);

      s[4] = _mm256_unpackhi_epi16(s0, s1);
      s[5] = _mm256_unpackhi_epi16(s2, s3);
      s[6] = _mm256_unpackhi_epi16(s4, s5);

      for (i = 0; i < h; i += 2) {
        const int16_t *data = &im_block[i * im_stride];

        const __m256i s6 =
            _mm256_loadu_si256((__m256i *)(data + 6 * im_stride));
        const __m256i s7 =
            _mm256_loadu_si256((__m256i *)(data + 7 * im_stride));

        s[3] = _mm256_unpacklo_epi16(s6, s7);
        s[7] = _mm256_unpackhi_epi16(s6, s7);

        const __m256i res_a = convolve(s, coeffs_y);
        __m256i res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a, round_const_y), round_shift_y);

        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_bits), round_shift_bits);

        if (w - j > 4) {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b, round_const_y), round_shift_y);
          res_b_round =
              _mm256_sra_epi32(_mm256_add_epi32(res_b_round, round_const_bits),
                               round_shift_bits);

          __m256i res_16bit = _mm256_packs_epi32(res_a_round, res_b_round);
          res_16bit = _mm256_min_epi16(res_16bit, clip_pixel);
          res_16bit = _mm256_max_epi16(res_16bit, zero);

          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_16bit));
          _mm_storeu_si128((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_16bit, 1));
        } else if (w == 4) {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j],
                           _mm256_castsi256_si128(res_a_round));
          _mm_storel_epi64((__m128i *)&dst[i * dst_stride + j + dst_stride],
                           _mm256_extracti128_si256(res_a_round, 1));
        } else {
          res_a_round = _mm256_packs_epi32(res_a_round, res_a_round);
          res_a_round = _mm256_min_epi16(res_a_round, clip_pixel);
          res_a_round = _mm256_max_epi16(res_a_round, zero);

          xx_storel_32(&dst[i * dst_stride + j],
                       _mm256_castsi256_si128(res_a_round));
          xx_storel_32(&dst[i * dst_stride + j + dst_stride],
                       _mm256_extracti128_si256(res_a_round, 1));
        }

        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}